

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O3

void __thiscall pktalloc::Allocator::Free(Allocator *this,uint8_t *ptr)

{
  int iVar1;
  WindowHeader *this_00;
  WindowHeader **ppWVar2;
  WindowHeader *pWVar3;
  bool bVar4;
  uint uVar5;
  uint elements;
  
  if ((ptr != (uint8_t *)0x0) && (iVar1 = *(int *)(ptr + -0x18), iVar1 != 0)) {
    this_00 = *(WindowHeader **)(ptr + -0x20);
    ptr[-0x18] = '\0';
    ptr[-0x17] = '\0';
    ptr[-0x16] = '\0';
    ptr[-0x15] = '\0';
    if (this_00 == (WindowHeader *)0x0) {
      if ((ulong)ptr[-0x21] < 0x20) {
        free(ptr + -0x20 + ((ulong)ptr[-0x21] - 0x20));
        return;
      }
    }
    else {
      uVar5 = ((int)(ptr + -0x20) - (int)this_00) - 0x120U >> 5;
      if (uVar5 < this_00->ResumeScanOffset) {
        this_00->ResumeScanOffset = uVar5;
      }
      CustomBitSet<2048U>::ClearRange(&this_00->Used,uVar5,iVar1 + uVar5);
      uVar5 = iVar1 + this_00->FreeUnitCount;
      this_00->FreeUnitCount = uVar5;
      if (0x5ff < uVar5) {
        uVar5 = this_00->FullListIndex;
        if ((long)(int)uVar5 != -1) {
          this_00->ResumeScanOffset = 0;
          elements = (this->FullWindows).Size - 1;
          if (uVar5 < elements) {
            ppWVar2 = (this->FullWindows).DataPtr;
            pWVar3 = ppWVar2[(int)elements];
            ppWVar2[(int)uVar5] = pWVar3;
            pWVar3->FullListIndex = uVar5;
          }
          LightVector<pktalloc::Allocator::WindowHeader_*,_25U>::SetSize_Copy
                    (&this->FullWindows,elements);
          this_00->FullListIndex = -1;
          uVar5 = (this->PreferredWindows).Size;
          bVar4 = LightVector<pktalloc::Allocator::WindowHeader_*,_25U>::SetSize_Copy
                            (&this->PreferredWindows,uVar5 + 1);
          if (bVar4) {
            (this->PreferredWindows).DataPtr[uVar5] = this_00;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Allocator::Free(uint8_t* ptr)
{
    ALLOC_DEBUG_INTEGRITY_CHECK();

    if (!ptr) {
        return;
    }
    PKTALLOC_DEBUG_ASSERT((uintptr_t)ptr % kUnitSize == 0);

    AllocationHeader* regionHeader = (AllocationHeader*)(ptr - kUnitSize);
#ifdef PKTALLOC_DEBUG
    if (regionHeader->Canary != AllocationHeader::kCanaryExpected) {
        PKTALLOC_DEBUG_BREAK(); // Buffer overflow detected
        return;
    }
#endif // PKTALLOC_DEBUG
    if (regionHeader->IsFreed()) {
        PKTALLOC_DEBUG_BREAK(); // Double-free
        return;
    }

    WindowHeader* window = regionHeader->Header;
    if (!window)
    {
        regionHeader->UsedUnits = 0; // Mark freed
        fallbackFree(ptr);
        return;
    }

    const unsigned units = regionHeader->UsedUnits;
    PKTALLOC_DEBUG_ASSERT(units >= 2 && units <= kFallbackThresholdUnits);
    regionHeader->UsedUnits = 0; // Mark freed

    PKTALLOC_DEBUG_ASSERT((uint8_t*)regionHeader >= (uint8_t*)regionHeader->Header + kWindowHeaderBytes);
    unsigned regionStart = regionHeader->GetUnitStart();
    PKTALLOC_DEBUG_ASSERT(regionStart < kWindowMaxUnits);
    PKTALLOC_DEBUG_ASSERT(regionStart + units <= kWindowMaxUnits);

    unsigned regionEnd = regionStart + units;

    // Resume scanning from this hole next time
    if (window->ResumeScanOffset > regionStart) {
        window->ResumeScanOffset = regionStart;
    }

    // Clear the units it was using
    window->Used.ClearRange(regionStart, regionEnd);

    // Give back the unit count
    window->FreeUnitCount += units;

    // If we may want to promote this to Preferred:
    if (window->FreeUnitCount >= kPreferredThresholdUnits &&
        window->FullListIndex != kNotInFullList)
    {
        // Restart scanning from the front
        window->ResumeScanOffset = 0;

        // Swap last item in full list into the slot
        const unsigned fullCount = FullWindows.GetSize();
        const unsigned fullIndex = (unsigned)window->FullListIndex;
        PKTALLOC_DEBUG_ASSERT(fullIndex < fullCount);
        PKTALLOC_DEBUG_ASSERT(fullCount > 0);
        if (fullIndex < fullCount - 1)
        {
            WindowHeader* replacement = FullWindows.GetRef(fullCount - 1);
            FullWindows.GetRef(fullIndex) = replacement;
            replacement->FullListIndex = fullIndex;
        }
        FullWindows.SetSize_Copy(fullCount - 1);

        window->FullListIndex = kNotInFullList;
        PreferredWindows.Append(window);
    }

#ifdef PKTALLOC_SHRINK
    // If we should do some bulk cleanup:
    if (window->FreeUnitCount >= kWindowMaxUnits &&
        !window->Preallocated &&
        ++EmptyWindowCount >= kEmptyWindowCleanupThreshold)
    {
        freeEmptyWindows();
    }
#endif // PKTALLOC_SHRINK

    ALLOC_DEBUG_INTEGRITY_CHECK();
}